

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_block.cpp
# Opt level: O1

void multikey_block<1024u,unsigned_short>(uchar **strings,size_t n,size_t depth)

{
  size_t *psVar1;
  uchar *puVar2;
  _List_node_base *p_Var3;
  _List_node_base *__dest;
  pointer ppppuVar4;
  size_t n_00;
  size_t n_01;
  unsigned_short uVar5;
  ushort uVar6;
  uint j;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  long lVar9;
  long lVar10;
  undefined2 uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  uchar **ppuVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  array<unsigned_long,_3UL> bucketsize;
  array<unsigned_short,_32UL> cache;
  char local_fa;
  _List_node_base *local_f0;
  vector<unsigned_char_***,_std::allocator<unsigned_char_***>_> local_d8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  size_t sStack_a0;
  size_t local_98;
  size_t local_90;
  size_t local_88;
  size_t local_80;
  long local_78;
  allocator_type local_70 [64];
  
  if (n < 10000) {
    mkqsort(strings,(int)n,(int)depth);
    return;
  }
  if (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
      buckets_abi_cxx11_ == '\0') {
    multikey_block<1024u,unsigned_short>();
  }
  if (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
      freeblocks_abi_cxx11_ == '\0') {
    multikey_block<1024u,unsigned_short>();
  }
  uVar5 = pseudo_median<unsigned_short>(strings,n,depth);
  std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::vector
            (&local_d8,(n >> 10) + 1,local_70);
  local_a8 = 0;
  sStack_a0 = 0;
  local_98 = 0;
  p_Var7 = multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
           buckets_abi_cxx11_._M_elems[0].
           super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var7 != (_List_node_base *)
                   &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                    ::buckets_abi_cxx11_) {
    p_Var8 = (((list<unsigned_char_**,_std::allocator<unsigned_char_**>_> *)&p_Var7->_M_next)->
             super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var7);
    p_Var7 = p_Var8;
  }
  multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
  buckets_abi_cxx11_._M_elems[0].
  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       (_List_node_base *)
       &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
        buckets_abi_cxx11_;
  multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
  buckets_abi_cxx11_._M_elems[0].
  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
  super__List_node_base._M_next =
       (_List_node_base *)
       &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
        buckets_abi_cxx11_;
  multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
  buckets_abi_cxx11_._M_elems[0].
  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node._M_size = 0;
  p_Var7 = multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
           buckets_abi_cxx11_._M_elems[1].
           super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var7 != (_List_node_base *)
                   (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                    ::buckets_abi_cxx11_._M_elems + 1)) {
    p_Var8 = p_Var7->_M_next;
    operator_delete(p_Var7);
    p_Var7 = p_Var8;
  }
  multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
  buckets_abi_cxx11_._M_elems[1].
  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       (_List_node_base *)
       (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
        buckets_abi_cxx11_._M_elems + 1);
  multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
  buckets_abi_cxx11_._M_elems[1].
  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
  super__List_node_base._M_next =
       (_List_node_base *)
       (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
        buckets_abi_cxx11_._M_elems + 1);
  multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
  buckets_abi_cxx11_._M_elems[1].
  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node._M_size = 0;
  p_Var7 = multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
           buckets_abi_cxx11_._M_elems[2].
           super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var7 != (_List_node_base *)
                   (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                    ::buckets_abi_cxx11_._M_elems + 2)) {
    p_Var8 = p_Var7->_M_next;
    operator_delete(p_Var7);
    p_Var7 = p_Var8;
  }
  multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
  buckets_abi_cxx11_._M_elems[2].
  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       (_List_node_base *)
       (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
        buckets_abi_cxx11_._M_elems + 2);
  multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
  buckets_abi_cxx11_._M_elems[2].
  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
  super__List_node_base._M_next =
       (_List_node_base *)
       (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
        buckets_abi_cxx11_._M_elems + 2);
  multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
  buckets_abi_cxx11_._M_elems[2].
  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node._M_size = 0;
  if (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
      freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
      _M_impl._M_node.super__List_node_base._M_next !=
      (_List_node_base *)
      &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
       freeblocks_abi_cxx11_) {
    __assert_fail("freeblocks.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                  ,0x54,
                  "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned short]"
                 );
  }
  lVar13 = 0;
  multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
  freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)
       &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
        freeblocks_abi_cxx11_;
  do {
    p_Var7 = (_List_node_base *)operator_new(0x18);
    p_Var7[1]._M_next =
         (_List_node_base *)
         ((long)multikey_block<1024U,_unsigned_short>::temp_space._M_elems + lVar13);
    std::__detail::_List_node_base::_M_hook(p_Var7);
    multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
    freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
    _M_impl._M_node._M_size =
         multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
         freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
         ._M_impl._M_node._M_size + 1;
    lVar13 = lVar13 + 0x2000;
  } while (lVar13 != 0x40000);
  if ((n & 0xfffffffffffffc00) != 0) {
    uVar17 = 0;
    p_Var7 = (_List_node_base *)strings;
    do {
      p_Var8 = (_List_node_base *)operator_new(0x18);
      p_Var8[1]._M_next = p_Var7;
      std::__detail::_List_node_base::_M_hook(p_Var8);
      multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
      freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
      _M_impl._M_node._M_size =
           multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
           freeblocks_abi_cxx11_.
           super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
           _M_size + 1;
      uVar17 = uVar17 + 0x400;
      p_Var7 = p_Var7 + 0x200;
    } while (uVar17 < (n & 0xfffffffffffffc00));
  }
  local_c0 = n & 0xffffffffffffffe0;
  local_b8 = n;
  if (local_c0 == 0) {
    uVar17 = 0;
  }
  else {
    uVar17 = 0;
    ppuVar15 = strings;
    do {
      lVar13 = 0;
      do {
        puVar2 = ppuVar15[lVar13];
        if (puVar2 == (uchar *)0x0) goto LAB_001aface;
        if (puVar2[depth] == '\0') {
          uVar11 = 0;
        }
        else {
          uVar11 = CONCAT11(puVar2[depth],puVar2[depth + 1]);
        }
        *(undefined2 *)(local_70 + lVar13 * 2) = uVar11;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x20);
      lVar13 = 0;
      local_b0 = uVar17;
      do {
        p_Var7 = multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
                 freeblocks_abi_cxx11_.
                 super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 _M_node.super__List_node_base._M_next;
        lVar12 = (ulong)(*(ushort *)(local_70 + lVar13 * 2) == uVar5) +
                 (ulong)(uVar5 < *(ushort *)(local_70 + lVar13 * 2)) * 2;
        uVar17 = (&local_a8)[lVar12];
        uVar18 = uVar17 & 0x3ff;
        if (uVar18 == 0) {
          if (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
              freeblocks_abi_cxx11_.
              super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
              super__List_node_base._M_next ==
              (_List_node_base *)
              &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
               freeblocks_abi_cxx11_) goto LAB_001afaaf;
          p_Var8 = multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                   ::freeblocks_abi_cxx11_.
                   super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                   _M_node.super__List_node_base._M_next[1]._M_next;
          multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
          freeblocks_abi_cxx11_.
          super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
          _M_size = multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                    ::freeblocks_abi_cxx11_.
                    super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    _M_node._M_size - 1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(p_Var7);
          p_Var7 = (_List_node_base *)operator_new(0x18);
          p_Var7[1]._M_next = p_Var8;
          std::__detail::_List_node_base::_M_hook(p_Var7);
          psVar1 = &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                    ::buckets_abi_cxx11_._M_elems[lVar12].
                    super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    _M_node._M_size;
          *psVar1 = *psVar1 + 1;
          if (p_Var8 < (_List_node_base *)(strings + n) && strings <= p_Var8) {
            lVar9 = (long)p_Var8 - (long)strings >> 3;
            lVar10 = lVar9 + 0x3ff;
            if (-1 < lVar9) {
              lVar10 = lVar9;
            }
            local_d8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar10 >> 10] =
                 (uchar ***)
                 (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                  ::buckets_abi_cxx11_._M_elems[lVar12].
                  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  _M_node.super__List_node_base._M_prev + 1);
          }
        }
        if ((((_List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_> *)
             &((_List_node_base *)
              (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
               buckets_abi_cxx11_._M_elems + lVar12))->_M_next)->_M_impl)._M_node.
            super__List_node_base._M_next ==
            (_List_node_base *)
            (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
             buckets_abi_cxx11_._M_elems + lVar12)) {
          __assert_fail("not buckets[b].empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                        ,0x6e,
                        "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned short]"
                       );
        }
        (&(multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
           buckets_abi_cxx11_._M_elems[lVar12].
           super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
           super__List_node_base._M_prev[1]._M_next)->_M_next)[uVar18] =
             (_List_node_base *)ppuVar15[lVar13];
        (&local_a8)[lVar12] = uVar17 + 1;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x20);
      uVar17 = local_b0 + 0x20;
      ppuVar15 = ppuVar15 + 0x20;
    } while (uVar17 < local_c0);
  }
  if (uVar17 < local_b8) {
    p_Var7 = (_List_node_base *)(strings + local_b8);
    do {
      p_Var8 = multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
               freeblocks_abi_cxx11_.
               super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node
               .super__List_node_base._M_next;
      puVar2 = strings[uVar17];
      if (puVar2 == (uchar *)0x0) {
LAB_001aface:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (puVar2[depth] == '\0') {
        uVar6 = 0;
      }
      else {
        uVar6 = CONCAT11(puVar2[depth],puVar2[depth + 1]);
      }
      lVar13 = (ulong)(uVar6 == uVar5) + (ulong)(uVar5 < uVar6) * 2;
      uVar18 = (&local_a8)[lVar13];
      uVar16 = uVar18 & 0x3ff;
      if (uVar16 == 0) {
        if (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
            freeblocks_abi_cxx11_.
            super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
            super__List_node_base._M_next ==
            (_List_node_base *)
            &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
             freeblocks_abi_cxx11_) {
LAB_001afaaf:
          __assert_fail("not fb.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                        ,0x3a,"Block take_free_block(FreeBlocks &)");
        }
        p_Var3 = multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
                 freeblocks_abi_cxx11_.
                 super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 _M_node.super__List_node_base._M_next[1]._M_next;
        multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
        freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
        _M_impl._M_node._M_size =
             multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
             freeblocks_abi_cxx11_.
             super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
             _M_size - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var8);
        p_Var8 = (_List_node_base *)operator_new(0x18);
        p_Var8[1]._M_next = p_Var3;
        std::__detail::_List_node_base::_M_hook(p_Var8);
        psVar1 = &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                  ::buckets_abi_cxx11_._M_elems[lVar13].
                  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
        if (p_Var3 < p_Var7 && strings <= p_Var3) {
          lVar10 = (long)p_Var3 - (long)strings >> 3;
          lVar12 = lVar10 + 0x3ff;
          if (-1 < lVar10) {
            lVar12 = lVar10;
          }
          local_d8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl
          .super__Vector_impl_data._M_start[lVar12 >> 10] =
               (uchar ***)
               (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
                buckets_abi_cxx11_._M_elems[lVar13].
                super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                _M_node.super__List_node_base._M_prev + 1);
        }
      }
      if ((((_List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_> *)
           &((_List_node_base *)
            (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
             buckets_abi_cxx11_._M_elems + lVar13))->_M_next)->_M_impl)._M_node.
          super__List_node_base._M_next ==
          (_List_node_base *)
          (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
           buckets_abi_cxx11_._M_elems + lVar13)) {
        __assert_fail("not buckets[b].empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                      ,0x80,
                      "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned short]"
                     );
      }
      (&(multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
         buckets_abi_cxx11_._M_elems[lVar13].
         super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
         super__List_node_base._M_prev[1]._M_next)->_M_next)[uVar16] =
           (_List_node_base *)strings[uVar17];
      (&local_a8)[lVar13] = uVar18 + 1;
      uVar17 = uVar17 + 1;
    } while (local_b8 != uVar17);
  }
  local_80 = local_a8;
  local_88 = sStack_a0;
  local_90 = local_98;
  if (local_a8 + sStack_a0 + local_98 != local_b8) {
    __assert_fail("bucketsize[0]+bucketsize[1]+bucketsize[2]==n",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                  ,0x84,
                  "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned short]"
                 );
  }
  p_Var7 = (_List_node_base *)(strings + local_b8);
  lVar13 = 0;
  uVar17 = 0;
  do {
    uVar18 = (&local_a8)[lVar13];
    local_78 = lVar13;
    if (uVar18 != 0) {
      local_f0 = (_List_node_base *)
                 (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                  ::buckets_abi_cxx11_._M_elems + lVar13);
      uVar16 = 0;
      local_c0 = uVar18;
      do {
        uVar14 = uVar18 - uVar16;
        if (0x3ff < uVar14) {
          uVar14 = 0x400;
        }
        local_f0 = (((_List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_> *)
                    &local_f0->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        p_Var8 = (_List_node_base *)(strings + uVar17);
        if (local_f0[1]._M_next == p_Var8) {
          if ((uVar17 & 0x3ff) != 0) {
            __assert_fail("pos%B==0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                          ,0x92,
                          "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned short]"
                         );
          }
          *(undefined8 *)
           ((long)local_d8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>
                  ._M_impl.super__Vector_impl_data._M_start + (uVar17 >> 7)) = 0;
        }
        else {
          uVar18 = (uVar14 + uVar17) - 1 >> 10;
          if (local_d8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar18] != (uchar ***)0x0) {
            do {
              local_b0 = uVar18;
              p_Var3 = multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                       ::freeblocks_abi_cxx11_.
                       super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl
                       ._M_node.super__List_node_base._M_next;
              if (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                  ::freeblocks_abi_cxx11_.
                  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  _M_node.super__List_node_base._M_next ==
                  (_List_node_base *)
                  &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                   ::freeblocks_abi_cxx11_) goto LAB_001afaaf;
              __dest = multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                       ::freeblocks_abi_cxx11_.
                       super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl
                       ._M_node.super__List_node_base._M_next[1]._M_next;
              multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
              freeblocks_abi_cxx11_.
              super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
              _M_size = multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                        ::freeblocks_abi_cxx11_.
                        super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                        _M_impl._M_node._M_size - 1;
              std::__detail::_List_node_base::_M_unhook();
              operator_delete(p_Var3);
              uVar18 = local_b0;
              ppppuVar4 = local_d8.
                          super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
                          _M_impl.super__Vector_impl_data._M_start;
            } while ((strings <= __dest) && (__dest < p_Var8));
            local_b8 = uVar17;
            if (__dest < p_Var7 && strings <= __dest) {
              lVar12 = (long)__dest - (long)strings >> 3;
              lVar13 = lVar12 + 0x3ff;
              if (-1 < lVar12) {
                lVar13 = lVar12;
              }
              if (local_d8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar13 >> 10] != (uchar ***)0x0) {
                __assert_fail("backlinks[(tmp-strings)/B]==0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                              ,0xa2,
                              "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned short]"
                             );
              }
              local_d8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar13 >> 10] =
                   local_d8.
                   super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl
                   .super__Vector_impl_data._M_start[local_b0];
            }
            memcpy(__dest,*local_d8.
                           super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_b0],0x2000);
            *ppppuVar4[uVar18] = (uchar **)__dest;
            local_d8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar18] = (uchar ***)0x0;
            uVar17 = local_b8;
          }
          p_Var3 = local_f0[1]._M_next;
          if (p_Var3 < p_Var7 && strings <= p_Var3) {
            if (p_Var3 <= p_Var8) {
              __assert_fail("*it > strings+pos",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                            ,0xaa,
                            "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned short]"
                           );
            }
            lVar12 = (long)p_Var3 - (long)strings >> 3;
            lVar13 = lVar12 + 0x3ff;
            if (-1 < lVar12) {
              lVar13 = lVar12;
            }
            local_d8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar13 >> 10] = (uchar ***)0x0;
          }
          memcpy(p_Var8,local_f0[1]._M_next,uVar14 * 8);
          if (local_f0[1]._M_next < p_Var7 && strings <= local_f0[1]._M_next) {
            p_Var8 = (_List_node_base *)operator_new(0x18);
            p_Var8[1]._M_next = local_f0[1]._M_next;
          }
          else {
            p_Var8 = (_List_node_base *)operator_new(0x18);
            p_Var8[1]._M_next = local_f0[1]._M_next;
          }
          std::__detail::_List_node_base::_M_hook(p_Var8);
          multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
          freeblocks_abi_cxx11_.
          super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
          _M_size = multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                    ::freeblocks_abi_cxx11_.
                    super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    _M_node._M_size + 1;
          uVar18 = local_c0;
        }
        uVar17 = uVar17 + uVar14;
        uVar16 = uVar16 + 0x400;
      } while (uVar16 < uVar18);
    }
    lVar13 = local_78 + 1;
    p_Var8 = multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
             freeblocks_abi_cxx11_.
             super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
             super__List_node_base._M_next;
    ppppuVar4 = local_d8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
                _M_impl.super__Vector_impl_data._M_start;
    n_00 = local_88;
    n_01 = local_80;
    if (lVar13 == 3) {
      while (local_88 = n_00, local_80 = n_01,
            p_Var8 != (_List_node_base *)
                      &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                       ::freeblocks_abi_cxx11_) {
        p_Var7 = (((_List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_> *)
                  &p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        local_d8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl.
        super__Vector_impl_data._M_start = ppppuVar4;
        operator_delete(p_Var8);
        p_Var8 = p_Var7;
        ppppuVar4 = local_d8.
                    super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        n_00 = local_88;
        n_01 = local_80;
      }
      multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
      freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
      _M_impl._M_node.super__List_node_base._M_prev =
           (_List_node_base *)
           &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
            freeblocks_abi_cxx11_;
      multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
      freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
      _M_impl._M_node.super__List_node_base._M_next =
           (_List_node_base *)
           &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
            freeblocks_abi_cxx11_;
      multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
      freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
      _M_impl._M_node._M_size = 0;
      local_d8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (ppppuVar4 != (pointer)0x0) {
        operator_delete(ppppuVar4);
      }
      multikey_block<1024u,unsigned_short>(strings,n_01,depth);
      local_fa = (char)uVar5;
      if (local_fa != '\0') {
        multikey_block<1024u,unsigned_short>(strings + n_01,n_00,depth + 2);
      }
      multikey_block<1024u,unsigned_short>(strings + n_01 + n_00,local_90,depth);
      if (local_d8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.
                        super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

static void
multikey_block(unsigned char** strings, size_t n, size_t depth)
{
	if (n < 10000) {
		mkqsort(strings, n, depth);
		return;
	}
	assert(n > B);
	static Buckets buckets;
	static std::array<unsigned char*, 32*B> temp_space;
	static FreeBlocks freeblocks;
	const CharT partval = pseudo_median<CharT>(strings, n, depth);
	BackLinks backlinks(n/B+1);
	std::array<size_t, 3> bucketsize;
	bucketsize.fill(0);
	buckets[0].clear();
	buckets[1].clear();
	buckets[2].clear();
	// Initialize our list of free blocks.
	assert(freeblocks.empty());
	for (size_t i=0; i < 32; ++i)
		freeblocks.push_back(&temp_space[i*B]);
	for (size_t i=0; i < n-n%B; i+=B)
		freeblocks.push_back(strings+i);
	// Distribute strings to buckets. Use a small cache to reduce memory
	// stalls. The exact size of the cache is not very important.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		std::array<CharT, 32> cache;
		for (unsigned j=0; j<32; ++j) {
			cache[j] = get_char<CharT>(strings[i+j], depth);
		}
		for (unsigned j=0; j<32; ++j) {
			const CharT c = cache[j];
			const unsigned b = get_bucket(c, partval);
			if (bucketsize[b] % B == 0) {
				Block block = take_free_block(freeblocks);
				buckets[b].push_back(block);
				// Backlinks must be set for those blocks, that
				// use the original string array space.
				if (block >= strings && block < strings+n) {
					backlinks[(block-strings)/B] =
						&(buckets[b].back());
				}
			}
			assert(not buckets[b].empty());
			buckets[b].back()[bucketsize[b] % B] = strings[i+j];
			++bucketsize[b];
		}
	}
	for (; i < n; ++i) {
		const CharT c = get_char<CharT>(strings[i], depth);
		const unsigned b = get_bucket(c, partval);
		if (bucketsize[b] % B == 0) {
			Block block = take_free_block(freeblocks);
			buckets[b].push_back(block);
			// Backlinks must be set for those blocks, that
			// use the original string array space.
			if (block >= strings && block < strings+n) {
				backlinks[(block-strings)/B] =
					&(buckets[b].back());
			}
		}
		assert(not buckets[b].empty());
		buckets[b].back()[bucketsize[b] % B] = strings[i];
		++bucketsize[b];
	}
	assert(bucketsize[0]+bucketsize[1]+bucketsize[2]==n);
	// Process each bucket, and copy all strings in that bucket to proper
	// place in the original string pointer array. This means that those
	// positions that are occupied by other blocks must be moved to free
	// space etc.
	size_t pos = 0;
	for (unsigned i=0; i < 3; ++i) {
		if (bucketsize[i] == 0) continue;
		Bucket::const_iterator it = buckets[i].begin();
		for (size_t bucket_pos=0; bucket_pos < bucketsize[i]; ++it, bucket_pos+=B) {
			const size_t block_items = std::min(size_t(B), bucketsize[i]-bucket_pos);
			const size_t block_overlap = (pos+block_items-1)/B;
			if (*it == (strings+pos)) {
				// Already at correct place.
				assert(pos%B==0);
				backlinks[pos/B] = 0;
				pos += block_items;
				continue;
			}
			// Don't overwrite the block in the position we are
			// about to write to, but copy it into safety.
			if (backlinks[block_overlap]) {
				// Take a free block. The block can be 'stale',
				// i.e. it can point to positions we have
				// already copied new strings into. Take free
				// blocks until we have non-stale block.
				Block tmp = take_free_block(freeblocks);
				while (tmp >= strings && tmp < strings+pos)
					tmp = take_free_block(freeblocks);
				if (tmp >= strings && tmp < strings+n) {
					assert(backlinks[(tmp-strings)/B]==0);
					backlinks[(tmp-strings)/B] = backlinks[block_overlap];
				}
				memcpy(tmp, *(backlinks[block_overlap]), B*sizeof(unsigned char*));
				*(backlinks[block_overlap]) = tmp;
				backlinks[block_overlap] = 0;
			}
			if (*it >= strings && *it < strings+n) {
				assert(*it > strings+pos);
				backlinks[(*it-strings)/B] = 0;
			}
			// Copy string pointers to correct position.
			memcpy(strings+pos, *it, block_items*sizeof(unsigned char*));
			// Return block for later use. Favor those in the
			// temporary space.
			if (*it >= strings && *it < strings+n) {
				freeblocks.push_back(*it);
			} else {
				freeblocks.push_front(*it);
			}
			pos += block_items;
		}
	}
	freeblocks.clear();
	backlinks.clear(); BackLinks().swap(backlinks);
	multikey_block<B, CharT>(strings, bucketsize[0], depth);
	if (not is_end(partval))
		multikey_block<B, CharT>(strings+bucketsize[0], bucketsize[1],
				depth+sizeof(CharT));
	multikey_block<B, CharT>(strings+bucketsize[0]+bucketsize[1],
			bucketsize[2], depth);
}